

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat __thiscall Mat::Get(Mat *this,int min_m,int max_m,int min_n,int max_n)

{
  double *extraout_RDX;
  double *pdVar1;
  undefined4 in_register_00000034;
  int in_R9D;
  Mat MVar2;
  int local_38;
  int local_34;
  int in;
  int im;
  int i;
  int max_n_local;
  int min_n_local;
  int max_m_local;
  int min_m_local;
  Mat *this_local;
  Mat *getmat;
  
  Mat(this,(min_n - max_m) + 1,(in_R9D - max_n) + 1);
  in = 0;
  pdVar1 = extraout_RDX;
  for (local_34 = max_m; local_38 = max_n, local_34 < min_n + 1; local_34 = local_34 + 1) {
    for (; local_38 < in_R9D + 1; local_38 = local_38 + 1) {
      pdVar1 = (double *)
               (long)(local_34 * *(int *)(CONCAT44(in_register_00000034,min_m) + 4) + local_38);
      this->v_[in] = *(double *)
                      (*(long *)(CONCAT44(in_register_00000034,min_m) + 8) + (long)pdVar1 * 8);
      in = in + 1;
    }
  }
  MVar2.v_ = pdVar1;
  MVar2._0_8_ = this;
  return MVar2;
}

Assistant:

Mat Mat::Get(const int min_m, const int max_m, const int min_n, const int max_n) const
{
	Mat getmat(max_m-min_m+1,max_n-min_n+1);
	int i, im , in;  
	for(i = 0 , im=min_m; im<max_m+1;  ++im)
		for(in=min_n; in<max_n+1; ++i, ++in)		
			getmat.v_[i]=v_[im*n_cols_+in];
	return getmat;
}